

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser * init_parse_projection(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"code str code",parse_projection_code);
  parser_reg(p,"name str name",parse_projection_name);
  parser_reg(p,"type str type",parse_projection_type);
  parser_reg(p,"desc str desc",parse_projection_desc);
  parser_reg(p,"player-desc str desc",parse_projection_player_desc);
  parser_reg(p,"blind-desc str desc",parse_projection_blind_desc);
  parser_reg(p,"lash-desc str desc",parse_projection_lash_desc);
  parser_reg(p,"numerator uint num",parse_projection_numerator);
  parser_reg(p,"denominator rand denom",parse_projection_denominator);
  parser_reg(p,"divisor uint div",parse_projection_divisor);
  parser_reg(p,"damage-cap uint cap",parse_projection_damage_cap);
  parser_reg(p,"msgt sym type",parse_projection_message_type);
  parser_reg(p,"obvious uint answer",parse_projection_obvious);
  parser_reg(p,"wake uint answer",parse_projection_wake);
  parser_reg(p,"color sym color",parse_projection_color);
  return p;
}

Assistant:

static struct parser *init_parse_projection(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "code str code", parse_projection_code);
	parser_reg(p, "name str name", parse_projection_name);
	parser_reg(p, "type str type", parse_projection_type);
	parser_reg(p, "desc str desc", parse_projection_desc);
	parser_reg(p, "player-desc str desc", parse_projection_player_desc);
	parser_reg(p, "blind-desc str desc", parse_projection_blind_desc);
	parser_reg(p, "lash-desc str desc", parse_projection_lash_desc);
	parser_reg(p, "numerator uint num", parse_projection_numerator);
	parser_reg(p, "denominator rand denom", parse_projection_denominator);
	parser_reg(p, "divisor uint div", parse_projection_divisor);
	parser_reg(p, "damage-cap uint cap", parse_projection_damage_cap);
	parser_reg(p, "msgt sym type", parse_projection_message_type);
	parser_reg(p, "obvious uint answer", parse_projection_obvious);
	parser_reg(p, "wake uint answer", parse_projection_wake);
	parser_reg(p, "color sym color", parse_projection_color);
	return p;
}